

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d.cpp
# Opt level: O1

Image * rw::d3d::rasterToImage(Raster *raster)

{
  uint uVar1;
  uint8 *puVar2;
  code *pcVar3;
  int32 height;
  bool bVar4;
  uint uVar5;
  Image *this;
  int32 iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  uint8 *out;
  uint8 *puVar10;
  uint8 *local_48;
  
  puVar2 = raster->pixels;
  if (puVar2 == (uint8 *)0x0) {
    Raster::lock(raster,0,2);
  }
  lVar9 = (long)nativeRasterOffset;
  if (*(char *)((long)&raster->stride + lVar9 + 1) == '\x01') {
    iVar6 = raster->width;
    if (raster->width < 5) {
      iVar6 = 4;
    }
    height = 4;
    if (4 < raster->height) {
      height = raster->height;
    }
    this = Image::create(iVar6,height,0x20);
    Image::allocate(this);
    iVar7 = *(int *)((long)&raster->height + lVar9);
    if (iVar7 == 0x35545844) {
      iVar6 = 5;
LAB_00116c0a:
      Image::setPixelsDXT(this,iVar6,raster->pixels);
    }
    else {
      if (iVar7 == 0x33545844) {
        iVar6 = 3;
        goto LAB_00116c0a;
      }
      if (iVar7 != 0x31545844) {
        Image::destroy(this);
        if (puVar2 != (uint8 *)0x0) {
          return (Image *)0x0;
        }
        this = (Image *)0x0;
        goto LAB_00116d2b;
      }
      Image::setPixelsDXT(this,1,raster->pixels);
      if ((raster->format & 0xf00U) == 0x200) {
        Image::removeMask(this);
      }
    }
    this->width = raster->width;
    this->height = raster->height;
  }
  else {
    uVar1 = raster->format;
    uVar5 = (uVar1 & 0xf00) - 0x100;
    if ((0x9ff < uVar5) || (uVar5 = uVar5 >> 8, (0x231U >> (uVar5 & 0x1f) & 1) == 0)) {
      rasterToImage();
      return (Image *)0x0;
    }
    iVar7 = 0;
    if ((uVar1 >> 0xe & 1) == 0) {
      if ((uVar1 >> 0xd & 1) != 0) {
        iVar7 = 0x100;
        iVar6 = 8;
        goto LAB_00116c53;
      }
      iVar6 = *(int32 *)(&DAT_00135b20 + (ulong)uVar5 * 4);
      bVar4 = true;
    }
    else {
      iVar7 = 0x10;
      iVar6 = 4;
LAB_00116c53:
      bVar4 = false;
    }
    pcVar3 = (code *)(&PTR_conv_ARGB1555_from_ARGB1555_00148d28)[uVar5];
    this = Image::create(raster->width,raster->height,iVar6);
    Image::allocate(this);
    if (!bVar4) {
      puVar10 = *(uint8 **)((long)&raster->flags + lVar9);
      out = this->palette;
      iVar7 = iVar7 + (uint)(iVar7 == 0);
      do {
        conv_RGBA8888_from_RGBA8888(out,puVar10);
        puVar10 = puVar10 + 4;
        out = out + 4;
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
    }
    if (0 < this->height) {
      local_48 = this->pixels;
      iVar7 = 0;
      do {
        if (0 < this->width) {
          iVar8 = 0;
          puVar10 = local_48;
          do {
            (*pcVar3)(puVar10);
            puVar10 = puVar10 + this->bpp;
            iVar8 = iVar8 + 1;
          } while (iVar8 < this->width);
        }
        local_48 = local_48 + this->stride;
        iVar7 = iVar7 + 1;
      } while (iVar7 < this->height);
    }
    Image::compressPalette(this);
  }
  if (puVar2 != (uint8 *)0x0) {
    return this;
  }
LAB_00116d2b:
  Raster::unlock(raster,0);
  return this;
}

Assistant:

Image*
rasterToImage(Raster *raster)
{
	int32 depth;
	Image *image;

	bool unlock = false;
	if(raster->pixels == nil){
		raster->lock(0, Raster::LOCKREAD);
		unlock = true;
	}

	D3dRaster *natras = GETD3DRASTEREXT(raster);
	if(natras->customFormat){
		int w = raster->width;
		int h = raster->height;
		// pixels are in the upper right corner
		if(w < 4) w = 4;
		if(h < 4) h = 4;
		image = Image::create(w, h, 32);
		image->allocate();
		uint8 *pix = raster->pixels;
		switch(natras->format){
		case D3DFMT_DXT1:
			image->setPixelsDXT(1, pix);
			if((raster->format & 0xF00) == Raster::C565)
				image->removeMask();
			break;
		case D3DFMT_DXT3:
			image->setPixelsDXT(3, pix);
			break;
		case D3DFMT_DXT5:
			image->setPixelsDXT(5, pix);
			break;
		default:
			image->destroy();
			if(unlock)
				raster->unlock(0);
			return nil;
		}
		// fix it up again
		image->width = raster->width;
		image->height = raster->height;

		if(unlock)
			raster->unlock(0);
		return image;
	}

	void (*conv)(uint8 *out, uint8 *in) = nil;
	switch(raster->format & 0xF00){
	case Raster::C1555:
		depth = 16;
		conv = conv_ARGB1555_from_ARGB1555;
		break;
	case Raster::C8888:
		depth = 32;
		conv = conv_RGBA8888_from_BGRA8888;
		break;
	case Raster::C888:
		depth = 24;
		conv = conv_RGB888_from_BGR888;
		break;
	case Raster::C555:
		depth = 16;
		conv = conv_ARGB1555_from_RGB555;
		break;

	default:
	case Raster::C565:
	case Raster::C4444:
	case Raster::LUM8:
		RWERROR((ERR_INVRASTER));
		return nil;
	}
	int32 pallength = 0;
	if((raster->format & Raster::PAL4) == Raster::PAL4){
		depth = 4;
		pallength = 16;
	}else if((raster->format & Raster::PAL8) == Raster::PAL8){
		depth = 8;
		pallength = 256;
	}

	uint8 *in, *out;
	image = Image::create(raster->width, raster->height, depth);
	image->allocate();

	if(pallength){
		out = image->palette;
		in = (uint8*)natras->palette;
		for(int32 i = 0; i < pallength; i++){
			conv_RGBA8888_from_RGBA8888(out, in);
			in += 4;
			out += 4;
		}
	}

	uint8 *imgpixels = image->pixels;
	uint8 *pixels = raster->pixels;

	int x, y;
	assert(image->width == raster->width);
	assert(image->height == raster->height);
	for(y = 0; y < image->height; y++){
		uint8 *imgrow = imgpixels;
		uint8 *rasrow = pixels;
		for(x = 0; x < image->width; x++){
			conv(imgrow, rasrow);
			imgrow += image->bpp;
			rasrow += natras->bpp;
		}
		imgpixels += image->stride;
		pixels += raster->stride;
	}
	image->compressPalette();

	if(unlock)
		raster->unlock(0);

	return image;
}